

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
::
Insert<(JsUtil::SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
          (SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
  *pSVar1;
  long lVar2;
  TBKey key_00;
  code *pcVar3;
  uint uVar4;
  type tVar5;
  bool bVar6;
  uint targetBucket;
  int iVar7;
  int iVar8;
  undefined4 *puVar9;
  uint hashCode;
  uint last;
  long lVar10;
  uint local_34 [2];
  int i;
  
  lVar10 = *(long *)(this + 8);
  if (lVar10 == 0) {
    SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::Initialize((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this,0);
    lVar10 = *(long *)(this + 8);
  }
  hashCode = (uint)((ulong)*key >> 3) | 1;
  targetBucket = SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 ::GetBucket((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                              *)this,hashCode);
  lVar2 = *(long *)(this + 0x10);
  uVar4 = *(uint *)(lVar10 + (ulong)targetBucket * 4);
  last = 0xffffffff;
  while (local_34[0] = uVar4, -1 < (int)local_34[0]) {
    key_00 = *(TBKey *)(*(long *)(this + 0x18) + (ulong)local_34[0] * 0x10);
    tVar5 = SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveIfCollected<true>
                      ((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                        *)this,key_00,(int *)local_34,last,targetBucket);
    uVar4 = local_34[0];
    if (!tVar5) {
      if (key_00 == *key) {
        *(TBValue *)(*(long *)(this + 0x10) + (long)(int)local_34[0] * 8) = *value;
        return local_34[0];
      }
      uVar4 = *(uint *)(lVar2 + 4 + (long)(int)local_34[0] * 8);
      last = local_34[0];
    }
  }
  iVar7 = *(int *)(this + 0x38);
  if (iVar7 == 0) {
    if (*(int *)(this + 0x30) == *(int *)(this + 0x28)) {
      (*(code *)**(undefined8 **)this)(this);
      iVar7 = *(int *)(this + 0x38);
      if (iVar7 != 0) goto LAB_00bce816;
    }
    iVar8 = *(int *)(this + 0x28);
    iVar7 = *(int *)(this + 0x30);
    if (iVar7 == iVar8) {
      SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      ::Resize((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                *)this);
      targetBucket = SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                     ::GetBucket((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                                  *)this,hashCode);
      iVar8 = *(int *)(this + 0x28);
      iVar7 = *(int *)(this + 0x30);
    }
    *(int *)(this + 0x30) = iVar7 + 1;
    if (iVar8 < iVar7 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x2ba,"(count <= size)","count <= size");
      if (!bVar6) goto LAB_00bceaed;
      *puVar9 = 0;
      iVar8 = *(int *)(this + 0x28);
    }
    if (iVar8 <= iVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,699,"(index < size)","index < size");
      if (!bVar6) goto LAB_00bceaed;
      *puVar9 = 0;
    }
  }
  else {
LAB_00bce816:
    if (iVar7 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29d,"(freeCount > 0)","freeCount > 0");
      if (!bVar6) goto LAB_00bceaed;
      *puVar9 = 0;
    }
    iVar7 = *(int *)(this + 0x34);
    if (iVar7 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29e,"(freeList >= 0)","freeList >= 0");
      if (!bVar6) goto LAB_00bceaed;
      *puVar9 = 0;
      iVar7 = *(int *)(this + 0x34);
    }
    if (*(int *)(this + 0x30) <= iVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29f,"(freeList < count)","freeList < count");
      if (!bVar6) goto LAB_00bceaed;
      *puVar9 = 0;
      iVar7 = *(int *)(this + 0x34);
    }
    pSVar1 = this + 0x38;
    *(int *)pSVar1 = *(int *)pSVar1 + -1;
    if (*(int *)pSVar1 != 0) {
      lVar10 = *(long *)(this + 0x10);
      iVar8 = *(int *)(lVar10 + 4 + (long)iVar7 * 8);
      if (-2 < iVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x1a9,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
        if (!bVar6) {
LAB_00bceaed:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
        iVar8 = *(int *)(lVar10 + 4 + (long)iVar7 * 8);
      }
      *(int *)(this + 0x34) = -2 - iVar8;
    }
  }
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ::SetKeyValue<true>((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                       *)this,key,value,iVar7);
  lVar10 = *(long *)(this + 8);
  *(undefined4 *)(*(long *)(this + 0x10) + 4 + (long)iVar7 * 8) =
       *(undefined4 *)(lVar10 + (ulong)targetBucket * 4);
  *(int *)(lVar10 + (ulong)targetBucket * 4) = iVar7;
  return iVar7;
}

Assistant:

int Insert(const TBKey& key, const TBValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCodeWithKey<TBKey>(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }

                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            SetValue(value, i);
                            return i;
                        }
                        return -1;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (freeCount == 0 && count == size)
            {
                this->Cleanup();
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if (freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            SetKeyValue(key, value, index);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

            return index;
        }